

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O0

void us_loop_run(us_loop_t *loop)

{
  uint uVar1;
  uint uVar2;
  us_poll_t *p;
  int iVar3;
  uint uVar4;
  long in_RDI;
  int error;
  int events;
  us_poll_t *poll;
  int in_stack_00000108;
  int in_stack_0000010c;
  us_poll_t *in_stack_00000110;
  
  us_loop_integrate((us_loop_t *)0x108023);
  while (*(int *)(in_RDI + 0x58) != 0) {
    us_internal_loop_pre((us_loop_t *)0x10803c);
    iVar3 = epoll_wait(*(int *)(in_RDI + 100),(epoll_event *)(in_RDI + 0x68),0x400,-1);
    *(int *)(in_RDI + 0x5c) = iVar3;
    *(undefined4 *)(in_RDI + 0x60) = 0;
    while (*(int *)(in_RDI + 0x60) < *(int *)(in_RDI + 0x5c)) {
      p = *(us_poll_t **)(in_RDI + (long)*(int *)(in_RDI + 0x60) * 0xc + 0x6c);
      if (p != (us_poll_t *)0x0) {
        uVar1 = *(uint *)(in_RDI + 0x68 + (long)*(int *)(in_RDI + 0x60) * 0xc);
        uVar2 = *(uint *)(in_RDI + 0x68 + (long)*(int *)(in_RDI + 0x60) * 0xc);
        uVar4 = us_poll_events(p);
        if (((uVar4 & uVar1) != 0) || ((uVar2 & 0x18) != 0)) {
          us_internal_dispatch_ready_poll(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
        }
      }
      *(int *)(in_RDI + 0x60) = *(int *)(in_RDI + 0x60) + 1;
    }
    us_internal_loop_post((us_loop_t *)0x108143);
  }
  return;
}

Assistant:

void us_loop_run(struct us_loop_t *loop) {
    us_loop_integrate(loop);

    /* While we have non-fallthrough polls we shouldn't fall through */
    while (loop->num_polls) {
        /* Emit pre callback */
        us_internal_loop_pre(loop);

        /* Fetch ready polls */
#ifdef LIBUS_USE_EPOLL
        loop->num_ready_polls = epoll_wait(loop->fd, loop->ready_polls, 1024, -1);
#else
        loop->num_ready_polls = kevent(loop->fd, NULL, 0, loop->ready_polls, 1024, NULL);
#endif

        /* Iterate ready polls, dispatching them by type */
        for (loop->current_ready_poll = 0; loop->current_ready_poll < loop->num_ready_polls; loop->current_ready_poll++) {
            struct us_poll_t *poll = GET_READY_POLL(loop, loop->current_ready_poll);
            /* Any ready poll marked with nullptr will be ignored */
            if (poll) {
#ifdef LIBUS_USE_EPOLL
                int events = loop->ready_polls[loop->current_ready_poll].events;
                int error = loop->ready_polls[loop->current_ready_poll].events & (EPOLLERR | EPOLLHUP);
#else
                /* EVFILT_READ, EVFILT_TIME, EVFILT_USER are all mapped to LIBUS_SOCKET_READABLE */
                int events = LIBUS_SOCKET_READABLE;
                if (loop->ready_polls[loop->current_ready_poll].filter == EVFILT_WRITE) {
                    events = LIBUS_SOCKET_WRITABLE;
                }
                int error = loop->ready_polls[loop->current_ready_poll].flags & (EV_ERROR | EV_EOF);
#endif
                /* Always filter all polls by what they actually poll for (callback polls always poll for readable) */
                events &= us_poll_events(poll);
                if (events || error) {
                    us_internal_dispatch_ready_poll(poll, error, events);
                }
            }
        }
        /* Emit post callback */
        us_internal_loop_post(loop);
    }
}